

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O0

CURLcode httpchunk_readwrite(Curl_easy *data,Curl_chunker *ch,Curl_cwriter *cw_next,char *buf,
                            size_t blen,size_t *pconsumed)

{
  undefined1 uVar1;
  byte bVar2;
  CURLofft CVar3;
  CURLcode CVar4;
  char *pcVar5;
  size_t blen_00;
  size_t trlen;
  char *tr;
  char *endptr;
  size_t piece;
  size_t *psStack_40;
  CURLcode result;
  size_t *pconsumed_local;
  size_t blen_local;
  char *buf_local;
  Curl_cwriter *cw_next_local;
  Curl_chunker *ch_local;
  Curl_easy *data_local;
  
  piece._4_4_ = CURLE_OK;
  *pconsumed = 0;
  if (ch->state == CHUNK_DONE) {
    return CURLE_OK;
  }
  if (ch->state == CHUNK_FAILED) {
    return CURLE_RECV_ERROR;
  }
  psStack_40 = pconsumed;
  pconsumed_local = (size_t *)blen;
  blen_local = (size_t)buf;
  buf_local = (char *)cw_next;
  cw_next_local = (Curl_cwriter *)ch;
  ch_local = (Curl_chunker *)data;
  if (((*(ulong *)&(data->set).field_0x8ba >> 0x23 & 1) != 0) && ((ch->field_0x42 & 1) == 0)) {
    if (cw_next == (Curl_cwriter *)0x0) {
      piece._4_4_ = Curl_client_write(data,1,buf,blen);
    }
    else {
      piece._4_4_ = Curl_cwriter_write(data,cw_next,1,buf,blen);
    }
    if (piece._4_4_ != CURLE_OK) {
      *(undefined4 *)&cw_next_local->next = 9;
      *(undefined4 *)((long)&cw_next_local->next + 4) = 6;
      return piece._4_4_;
    }
  }
  do {
    if (pconsumed_local == (size_t *)0x0) {
      return CURLE_OK;
    }
    switch(*(undefined4 *)&cw_next_local->next) {
    case 0:
      if ((((*(char *)blen_local < '0') || ('9' < *(char *)blen_local)) &&
          ((*(char *)blen_local < 'a' || ('f' < *(char *)blen_local)))) &&
         ((*(char *)blen_local < 'A' || ('F' < *(char *)blen_local)))) {
        if (*(char *)&cw_next_local[2].cwt == '\0') {
          Curl_failf((Curl_easy *)ch_local,"chunk hex-length char not a hex digit: 0x%x",
                     (ulong)(uint)(int)*(char *)blen_local);
          *(undefined4 *)&cw_next_local->next = 9;
          *(undefined4 *)((long)&cw_next_local->next + 4) = 2;
          return CURLE_RECV_ERROR;
        }
        *(undefined1 *)((long)&cw_next_local[2].cwt + (ulong)*(byte *)&cw_next_local[2].cwt + 1) = 0
        ;
        CVar3 = curlx_strtoofft((char *)((long)&cw_next_local[2].cwt + 1),&tr,0x10,
                                (curl_off_t *)cw_next_local);
        if (CVar3 != CURL_OFFT_OK) {
          Curl_failf((Curl_easy *)ch_local,"chunk hex-length not valid: \'%s\'",
                     (undefined1 *)((long)&cw_next_local[2].cwt + 1));
          *(undefined4 *)&cw_next_local->next = 9;
          *(undefined4 *)((long)&cw_next_local->next + 4) = 2;
          return CURLE_RECV_ERROR;
        }
        *(undefined4 *)&cw_next_local->next = 1;
      }
      else {
        if (0xf < *(byte *)&cw_next_local[2].cwt) {
          Curl_failf((Curl_easy *)ch_local,"chunk hex-length longer than %d",0x10);
          *(undefined4 *)&cw_next_local->next = 9;
          *(undefined4 *)((long)&cw_next_local->next + 4) = 1;
          return CURLE_RECV_ERROR;
        }
        uVar1 = *(undefined1 *)blen_local;
        bVar2 = *(byte *)&cw_next_local[2].cwt;
        *(byte *)&cw_next_local[2].cwt = bVar2 + 1;
        *(undefined1 *)((long)&cw_next_local[2].cwt + (ulong)bVar2 + 1) = uVar1;
        blen_local = blen_local + 1;
        pconsumed_local = (size_t *)((long)pconsumed_local + -1);
      }
      break;
    case 1:
      if (*(char *)blen_local == '\n') {
        if (cw_next_local->cwt == (Curl_cwtype *)0x0) {
          *(undefined4 *)&cw_next_local->next = 5;
        }
        else {
          *(undefined4 *)&cw_next_local->next = 2;
        }
      }
      blen_local = blen_local + 1;
      pconsumed_local = (size_t *)((long)pconsumed_local + -1);
      break;
    case 2:
      endptr = (char *)pconsumed_local;
      if ((long)cw_next_local->cwt < (long)pconsumed_local) {
        endptr = (char *)curlx_sotouz((curl_off_t)cw_next_local->cwt);
      }
      if (((*(ulong *)(ch_local[0x24].hexbuffer + 1) >> 0x23 & 1) == 0) &&
         ((cw_next_local[2].phase & 0x10000) == CURL_CW_RAW)) {
        if (buf_local == (char *)0x0) {
          piece._4_4_ = Curl_client_write((Curl_easy *)ch_local,1,(char *)blen_local,(size_t)endptr)
          ;
        }
        else {
          piece._4_4_ = Curl_cwriter_write((Curl_easy *)ch_local,(Curl_cwriter *)buf_local,1,
                                           (char *)blen_local,(size_t)endptr);
        }
        if (piece._4_4_ != CURLE_OK) {
          *(undefined4 *)&cw_next_local->next = 9;
          *(undefined4 *)((long)&cw_next_local->next + 4) = 6;
          return piece._4_4_;
        }
      }
      *psStack_40 = (size_t)(endptr + *psStack_40);
      cw_next_local->cwt = (Curl_cwtype *)((long)cw_next_local->cwt - (long)endptr);
      blen_local = (size_t)(endptr + blen_local);
      pconsumed_local = (size_t *)((long)pconsumed_local - (long)endptr);
      if (cw_next_local->cwt == (Curl_cwtype *)0x0) {
        *(undefined4 *)&cw_next_local->next = 3;
      }
      break;
    case 3:
      if (*(char *)blen_local == '\n') {
        Curl_httpchunk_reset
                  ((Curl_easy *)ch_local,(Curl_chunker *)cw_next_local,
                   (cw_next_local[2].phase & 0x10000) != CURL_CW_RAW);
      }
      else if (*(char *)blen_local != '\r') {
        *(undefined4 *)&cw_next_local->next = 9;
        *(undefined4 *)((long)&cw_next_local->next + 4) = 3;
        return CURLE_RECV_ERROR;
      }
      blen_local = blen_local + 1;
      pconsumed_local = (size_t *)((long)pconsumed_local + -1);
      break;
    case 4:
      if (*(char *)blen_local == '\n') {
        cw_next_local->cwt = (Curl_cwtype *)((long)pconsumed_local + -1);
        *(undefined4 *)&cw_next_local->next = 8;
        data_local._4_4_ = CURLE_OK;
      }
      else {
        *(undefined4 *)&cw_next_local->next = 9;
        *(undefined4 *)((long)&cw_next_local->next + 4) = 3;
        data_local._4_4_ = CURLE_RECV_ERROR;
      }
      return data_local._4_4_;
    case 5:
      if ((*(char *)blen_local == '\r') || (*(char *)blen_local == '\n')) {
        pcVar5 = Curl_dyn_ptr((dynbuf *)&cw_next_local->phase);
        if (pcVar5 == (char *)0x0) {
          *(undefined4 *)&cw_next_local->next = 7;
          break;
        }
        piece._4_4_ = Curl_dyn_addn((dynbuf *)&cw_next_local->phase,"\r\n",2);
        if (piece._4_4_ != CURLE_OK) {
          *(undefined4 *)&cw_next_local->next = 9;
          *(undefined4 *)((long)&cw_next_local->next + 4) = 5;
          return piece._4_4_;
        }
        pcVar5 = Curl_dyn_ptr((dynbuf *)&cw_next_local->phase);
        blen_00 = Curl_dyn_len((dynbuf *)&cw_next_local->phase);
        if ((*(ulong *)(ch_local[0x24].hexbuffer + 1) >> 0x23 & 1) == 0) {
          if (buf_local == (char *)0x0) {
            piece._4_4_ = Curl_client_write((Curl_easy *)ch_local,0x44,pcVar5,blen_00);
          }
          else {
            piece._4_4_ = Curl_cwriter_write((Curl_easy *)ch_local,(Curl_cwriter *)buf_local,0x44,
                                             pcVar5,blen_00);
          }
          if (piece._4_4_ != CURLE_OK) {
            *(undefined4 *)&cw_next_local->next = 9;
            *(undefined4 *)((long)&cw_next_local->next + 4) = 6;
            return piece._4_4_;
          }
        }
        Curl_dyn_reset((dynbuf *)&cw_next_local->phase);
        *(undefined4 *)&cw_next_local->next = 6;
        if (*(char *)blen_local == '\n') break;
      }
      else {
        CVar4 = Curl_dyn_addn((dynbuf *)&cw_next_local->phase,(void *)blen_local,1);
        if (CVar4 != CURLE_OK) {
          *(undefined4 *)&cw_next_local->next = 9;
          *(undefined4 *)((long)&cw_next_local->next + 4) = 5;
          return CVar4;
        }
        piece._4_4_ = CURLE_OK;
      }
      blen_local = blen_local + 1;
      pconsumed_local = (size_t *)((long)pconsumed_local + -1);
      break;
    case 6:
      if (*(char *)blen_local != '\n') {
        *(undefined4 *)&cw_next_local->next = 9;
        *(undefined4 *)((long)&cw_next_local->next + 4) = 3;
        return CURLE_RECV_ERROR;
      }
      *(undefined4 *)&cw_next_local->next = 7;
      blen_local = blen_local + 1;
      pconsumed_local = (size_t *)((long)pconsumed_local + -1);
      break;
    case 7:
      if ((*(char *)blen_local == '\r') || (*(char *)blen_local == '\n')) {
        if (*(char *)blen_local == '\r') {
          blen_local = blen_local + 1;
          pconsumed_local = (size_t *)((long)pconsumed_local + -1);
        }
        *(undefined4 *)&cw_next_local->next = 4;
      }
      else {
        *(undefined4 *)&cw_next_local->next = 5;
      }
      break;
    case 8:
      return CURLE_OK;
    case 9:
      return CURLE_RECV_ERROR;
    }
  } while( true );
}

Assistant:

static CURLcode httpchunk_readwrite(struct Curl_easy *data,
                                    struct Curl_chunker *ch,
                                    struct Curl_cwriter *cw_next,
                                    const char *buf, size_t blen,
                                    size_t *pconsumed)
{
  CURLcode result = CURLE_OK;
  size_t piece;

  *pconsumed = 0; /* nothing's written yet */
  /* first check terminal states that will not progress anywhere */
  if(ch->state == CHUNK_DONE)
    return CURLE_OK;
  if(ch->state == CHUNK_FAILED)
    return CURLE_RECV_ERROR;

  /* the original data is written to the client, but we go on with the
     chunk read process, to properly calculate the content length */
  if(data->set.http_te_skip && !ch->ignore_body) {
    if(cw_next)
      result = Curl_cwriter_write(data, cw_next, CLIENTWRITE_BODY, buf, blen);
    else
      result = Curl_client_write(data, CLIENTWRITE_BODY, (char *)buf, blen);
    if(result) {
      ch->state = CHUNK_FAILED;
      ch->last_code = CHUNKE_PASSTHRU_ERROR;
      return result;
    }
  }

  while(blen) {
    switch(ch->state) {
    case CHUNK_HEX:
      if(ISXDIGIT(*buf)) {
        if(ch->hexindex >= CHUNK_MAXNUM_LEN) {
          failf(data, "chunk hex-length longer than %d", CHUNK_MAXNUM_LEN);
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_TOO_LONG_HEX; /* longer than we support */
          return CURLE_RECV_ERROR;
        }
        ch->hexbuffer[ch->hexindex++] = *buf;
        buf++;
        blen--;
      }
      else {
        char *endptr;
        if(0 == ch->hexindex) {
          /* This is illegal data, we received junk where we expected
             a hexadecimal digit. */
          failf(data, "chunk hex-length char not a hex digit: 0x%x", *buf);
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_ILLEGAL_HEX;
          return CURLE_RECV_ERROR;
        }

        /* blen and buf are unmodified */
        ch->hexbuffer[ch->hexindex] = 0;
        if(curlx_strtoofft(ch->hexbuffer, &endptr, 16, &ch->datasize)) {
          failf(data, "chunk hex-length not valid: '%s'", ch->hexbuffer);
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_ILLEGAL_HEX;
          return CURLE_RECV_ERROR;
        }
        ch->state = CHUNK_LF; /* now wait for the CRLF */
      }
      break;

    case CHUNK_LF:
      /* waiting for the LF after a chunk size */
      if(*buf == 0x0a) {
        /* we're now expecting data to come, unless size was zero! */
        if(0 == ch->datasize) {
          ch->state = CHUNK_TRAILER; /* now check for trailers */
        }
        else
          ch->state = CHUNK_DATA;
      }

      buf++;
      blen--;
      break;

    case CHUNK_DATA:
      /* We expect 'datasize' of data. We have 'blen' right now, it can be
         more or less than 'datasize'. Get the smallest piece.
      */
      piece = blen;
      if(ch->datasize < (curl_off_t)blen)
        piece = curlx_sotouz(ch->datasize);

      /* Write the data portion available */
      if(!data->set.http_te_skip && !ch->ignore_body) {
        if(cw_next)
          result = Curl_cwriter_write(data, cw_next, CLIENTWRITE_BODY,
                                      buf, piece);
        else
          result = Curl_client_write(data, CLIENTWRITE_BODY,
                                    (char *)buf, piece);
        if(result) {
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_PASSTHRU_ERROR;
          return result;
        }
      }

      *pconsumed += piece;
      ch->datasize -= piece; /* decrease amount left to expect */
      buf += piece;    /* move read pointer forward */
      blen -= piece;   /* decrease space left in this round */

      if(0 == ch->datasize)
        /* end of data this round, we now expect a trailing CRLF */
        ch->state = CHUNK_POSTLF;
      break;

    case CHUNK_POSTLF:
      if(*buf == 0x0a) {
        /* The last one before we go back to hex state and start all over. */
        Curl_httpchunk_reset(data, ch, ch->ignore_body);
      }
      else if(*buf != 0x0d) {
        ch->state = CHUNK_FAILED;
        ch->last_code = CHUNKE_BAD_CHUNK;
        return CURLE_RECV_ERROR;
      }
      buf++;
      blen--;
      break;

    case CHUNK_TRAILER:
      if((*buf == 0x0d) || (*buf == 0x0a)) {
        char *tr = Curl_dyn_ptr(&ch->trailer);
        /* this is the end of a trailer, but if the trailer was zero bytes
           there was no trailer and we move on */

        if(tr) {
          size_t trlen;
          result = Curl_dyn_addn(&ch->trailer, (char *)STRCONST("\x0d\x0a"));
          if(result) {
            ch->state = CHUNK_FAILED;
            ch->last_code = CHUNKE_OUT_OF_MEMORY;
            return result;
          }
          tr = Curl_dyn_ptr(&ch->trailer);
          trlen = Curl_dyn_len(&ch->trailer);
          if(!data->set.http_te_skip) {
            if(cw_next)
              result = Curl_cwriter_write(data, cw_next,
                                          CLIENTWRITE_HEADER|
                                          CLIENTWRITE_TRAILER,
                                          tr, trlen);
            else
              result = Curl_client_write(data,
                                         CLIENTWRITE_HEADER|
                                         CLIENTWRITE_TRAILER,
                                         tr, trlen);
            if(result) {
              ch->state = CHUNK_FAILED;
              ch->last_code = CHUNKE_PASSTHRU_ERROR;
              return result;
            }
          }
          Curl_dyn_reset(&ch->trailer);
          ch->state = CHUNK_TRAILER_CR;
          if(*buf == 0x0a)
            /* already on the LF */
            break;
        }
        else {
          /* no trailer, we're on the final CRLF pair */
          ch->state = CHUNK_TRAILER_POSTCR;
          break; /* don't advance the pointer */
        }
      }
      else {
        result = Curl_dyn_addn(&ch->trailer, buf, 1);
        if(result) {
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_OUT_OF_MEMORY;
          return result;
        }
      }
      buf++;
      blen--;
      break;

    case CHUNK_TRAILER_CR:
      if(*buf == 0x0a) {
        ch->state = CHUNK_TRAILER_POSTCR;
        buf++;
        blen--;
      }
      else {
        ch->state = CHUNK_FAILED;
        ch->last_code = CHUNKE_BAD_CHUNK;
        return CURLE_RECV_ERROR;
      }
      break;

    case CHUNK_TRAILER_POSTCR:
      /* We enter this state when a CR should arrive so we expect to
         have to first pass a CR before we wait for LF */
      if((*buf != 0x0d) && (*buf != 0x0a)) {
        /* not a CR then it must be another header in the trailer */
        ch->state = CHUNK_TRAILER;
        break;
      }
      if(*buf == 0x0d) {
        /* skip if CR */
        buf++;
        blen--;
      }
      /* now wait for the final LF */
      ch->state = CHUNK_STOP;
      break;

    case CHUNK_STOP:
      if(*buf == 0x0a) {
        blen--;
        /* Record the length of any data left in the end of the buffer
           even if there's no more chunks to read */
        ch->datasize = blen;
        ch->state = CHUNK_DONE;
        return CURLE_OK;
      }
      else {
        ch->state = CHUNK_FAILED;
        ch->last_code = CHUNKE_BAD_CHUNK;
        return CURLE_RECV_ERROR;
      }
    case CHUNK_DONE:
      return CURLE_OK;

    case CHUNK_FAILED:
      return CURLE_RECV_ERROR;
    }

  }
  return CURLE_OK;
}